

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

IterationResult __thiscall helics::Federate::enterExecutingModeComplete(Federate *this)

{
  IterationResult IVar1;
  iteration_time iVar2;
  iteration_time res;
  handle asyncInfo;
  
  if ((this->singleThreadFederate != true) && ((this->currentMode)._M_i == PENDING_EXEC)) {
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (&asyncInfo,
               (this->asyncCallInfo)._M_t.
               super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               .
               super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
               ._M_head_impl);
    iVar2 = std::future<helics::iteration_time>::get(&(asyncInfo.data)->execFuture);
    res._9_7_ = 0;
    res.grantedTime.internalTimeCode = (long)iVar2._0_9_;
    res.state = (char)(iVar2._0_9_ >> 0x40);
    enteringExecutingMode(this,res);
    std::unique_lock<std::mutex>::~unique_lock(&asyncInfo.m_handle_lock);
    return iVar2.state;
  }
  IVar1 = enterExecutingMode(this,NO_ITERATIONS);
  return IVar1;
}

Assistant:

IterationResult Federate::enterExecutingModeComplete()
{
    if (singleThreadFederate) {
        return enterExecutingMode();
    }
    switch (currentMode.load()) {
        case Modes::PENDING_EXEC: {
            auto asyncInfo = asyncCallInfo->lock();
            try {
                auto res = asyncInfo->execFuture.get();
                enteringExecutingMode(res);
                return res.state;
            }
            catch (const std::exception&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
        }
        default:
            return enterExecutingMode();
    }
}